

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiPhraseFirst(Fts5Context *pCtx,int iPhrase,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  int iVar1;
  undefined8 in_RAX;
  int n;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = fts5CsrPoslist((Fts5Cursor *)pCtx,iPhrase,&pIter->a,&local_24);
  if (iVar1 == 0) {
    pIter->b = pIter->a + local_24;
    *piCol = 0;
    *piOff = 0;
    fts5ApiPhraseNext(pCtx,pIter,piCol,piOff);
  }
  return iVar1;
}

Assistant:

static int fts5ApiPhraseFirst(
  Fts5Context *pCtx, 
  int iPhrase, 
  Fts5PhraseIter *pIter, 
  int *piCol, int *piOff
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int n;
  int rc = fts5CsrPoslist(pCsr, iPhrase, &pIter->a, &n);
  if( rc==SQLITE_OK ){
    pIter->b = &pIter->a[n];
    *piCol = 0;
    *piOff = 0;
    fts5ApiPhraseNext(pCtx, pIter, piCol, piOff);
  }
  return rc;
}